

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O3

int Eigen::internal::coletree<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<int,_1,1,0,_1,1>>
              (SparseMatrix<double,_0,_int> *mat,Matrix<int,__1,_1,_0,__1,_1> *parent,
              Matrix<int,__1,_1,_0,__1,_1> *firstRowElt,Index *perm)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  Index *pIVar4;
  Index *pIVar5;
  Index *pIVar6;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  Index size_1;
  void *pvVar11;
  undefined8 *puVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  Index IVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  undefined8 local_98;
  int local_8c;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *local_80;
  long local_78;
  SparseMatrix<double,_0,_int> *local_70;
  ulong local_68;
  Matrix<int,__1,_1,_0,__1,_1> local_60;
  uint local_4c;
  ulong local_48;
  Index othersize;
  void *local_38;
  
  uVar16 = mat->m_outerSize;
  local_48 = (ulong)(int)uVar16;
  uVar10 = mat->m_innerSize;
  local_78 = (long)(int)uVar10;
  uVar2 = uVar16;
  if ((int)uVar10 < (int)uVar16) {
    uVar2 = uVar10;
  }
  local_80 = &parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
  local_70 = mat;
  if (local_48 != 0) {
    if (-1 < (int)uVar16) {
      local_38 = malloc(local_48 * 4);
      if (local_38 != (void *)0x0) {
        uVar15 = (ulong)(uVar16 & 0x7ffffffc);
        if (uVar16 < 4) {
          othersize = 0;
        }
        else {
          pvVar11 = memset(local_38,0,uVar15 * 4);
          othersize = CONCAT71((int7)((ulong)pvVar11 >> 8),1);
        }
        goto LAB_0014c861;
      }
    }
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar12 = std::streambuf::xsgetn;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  othersize = 0;
  uVar15 = 0;
  local_38 = (void *)0x0;
LAB_0014c861:
  uVar13 = local_48;
  iVar14 = (int)local_48;
  local_68 = local_48 & 0xffffffff;
  if ((long)uVar15 < (long)local_48) {
    memset((void *)((long)local_38 + (local_68 >> 2) * 0x10),0,
           local_48 * 4 + (local_68 >> 2) * -0x10);
  }
  if (iVar14 == 0) {
    local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
  }
  else {
    local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)malloc(uVar13 * 4);
    if (local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (int *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = std::streambuf::xsgetn;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  uVar19 = local_48;
  uVar9 = local_68;
  local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar13;
  if ((char)othersize != '\0') {
    uVar13 = 0;
    do {
      *(undefined1 (*) [16])
       (local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
       uVar13) = (undefined1  [16])0x0;
      uVar13 = uVar13 + 4;
    } while (uVar13 < uVar15);
  }
  if ((long)uVar15 < (long)local_48) {
    uVar15 = local_68 >> 2 & 0x3fffffff;
    memset(local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           uVar15 * 4,0,local_48 * 4 + uVar15 * -0x10);
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (local_80,(long)local_70->m_outerSize);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,local_78);
  local_98 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
  iVar14 = (int)uVar19;
  local_8c = iVar14;
  if ((long)local_98 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
  resizeLike<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)firstRowElt,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  uVar15 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (uVar15 != local_98) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                  ,0x1f2,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                 );
  }
  uVar13 = uVar15 + 3;
  if (-1 < (long)uVar15) {
    uVar13 = uVar15;
  }
  uVar13 = uVar13 & 0xfffffffffffffffc;
  if (3 < (long)uVar15) {
    lVar17 = 0;
    do {
      piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + lVar17;
      *piVar3 = local_98._4_4_;
      piVar3[1] = local_98._4_4_;
      piVar3[2] = local_98._4_4_;
      piVar3[3] = local_98._4_4_;
      lVar17 = lVar17 + 4;
    } while (lVar17 < (long)uVar13);
  }
  if ((long)uVar13 < (long)uVar15) {
    piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      piVar3[uVar13] = local_8c;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  if ((int)uVar2 < 0 && piVar3 != (int *)0x0) {
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if (((int)uVar2 < 0) ||
     (uVar15 = (ulong)(int)uVar2,
     (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
     (long)uVar15)) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  uVar16 = (uint)(uVar2 != 1);
  iVar23 = uVar16 * -4;
  iVar25 = uVar16 * -2;
  iVar24 = uVar16 * -3;
  iVar26 = -uVar16;
  uVar13 = uVar15;
  if ((((ulong)piVar3 & 3) == 0) &&
     (uVar13 = (ulong)(-((uint)((ulong)piVar3 >> 2) & 0x3fffffff) & 3), uVar15 <= uVar13)) {
    uVar13 = uVar15;
  }
  iVar21 = (int)(uVar15 - uVar13);
  iVar18 = iVar21 + 3;
  if (-1 < iVar21) {
    iVar18 = iVar21;
  }
  lVar17 = (long)(iVar18 >> 2);
  if (uVar13 != 0) {
    uVar19 = 0;
    do {
      iVar21 = 0;
      if (uVar2 != 1) {
        iVar21 = (int)uVar19;
      }
      iVar23 = iVar23 + uVar16;
      iVar24 = iVar24 + uVar16;
      iVar25 = iVar25 + uVar16;
      iVar26 = iVar26 + uVar16;
      piVar3[uVar19] = iVar21;
      uVar19 = uVar19 + 1;
    } while (uVar13 != uVar19);
  }
  lVar20 = uVar13 + lVar17 * 4;
  if (3 < (long)(uVar15 - uVar13)) {
    uVar19 = uVar13;
    do {
      iVar23 = iVar23 + uVar16 * 4;
      iVar24 = iVar24 + uVar16 * 4;
      iVar25 = iVar25 + uVar16 * 4;
      iVar26 = iVar26 + uVar16 * 4;
      piVar1 = piVar3 + uVar19;
      *piVar1 = iVar23;
      piVar1[1] = iVar24;
      piVar1[2] = iVar25;
      piVar1[3] = iVar26;
      uVar19 = uVar19 + 4;
    } while ((long)uVar19 < lVar20);
  }
  if (lVar20 < (long)uVar15) {
    do {
      iVar23 = (iVar18 >> 2) * 4 + (int)uVar13;
      if (uVar2 == 1) {
        iVar23 = 0;
      }
      piVar3[lVar17 * 4 + uVar13] = iVar23;
      uVar13 = uVar13 + 1;
    } while (uVar15 + lVar17 * -4 != uVar13);
  }
  othersize = (Index)firstRowElt;
  if (iVar14 != 0) {
    pIVar4 = (local_70->m_data).m_indices;
    pIVar5 = local_70->m_outerIndex;
    pIVar6 = local_70->m_innerNonZeros;
    uVar15 = 0;
    do {
      iVar14 = (int)uVar15;
      IVar22 = iVar14;
      if (perm != (Index *)0x0) {
        IVar22 = perm[uVar15];
      }
      lVar20 = (long)IVar22;
      iVar23 = pIVar5[lVar20];
      lVar17 = (long)iVar23;
      if (pIVar6 == (Index *)0x0) {
        IVar22 = pIVar5[lVar20 + 1];
      }
      else {
        IVar22 = pIVar6[lVar20] + iVar23;
      }
      if (iVar23 < IVar22) {
        piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        do {
          lVar20 = (long)pIVar4[lVar17];
          if ((lVar20 < 0) ||
             ((firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar20)) goto LAB_0014cd05;
          iVar23 = piVar3[lVar20];
          if (iVar14 < iVar23) {
            iVar23 = iVar14;
          }
          piVar3[lVar20] = iVar23;
          lVar17 = lVar17 + 1;
        } while (IVar22 != lVar17);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar9);
    if ((int)local_48 != 0) {
      uVar15 = 0;
      do {
        bVar7 = local_78 <= (long)uVar15;
        if (local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar15) {
LAB_0014cd05:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                       );
        }
        uVar16 = (uint)uVar15;
        local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [uVar15] = uVar16;
        *(uint *)((long)local_38 + uVar15 * 4) = uVar16;
        if ((local_80->m_storage).m_rows <= (long)uVar15) goto LAB_0014cd05;
        (local_80->m_storage).m_data[uVar15] = (int)local_48;
        uVar10 = uVar16;
        if (perm != (Index *)0x0) {
          uVar10 = perm[uVar15];
        }
        pIVar4 = (local_70->m_data).m_indices;
        lVar17 = (long)(int)uVar10;
        iVar14 = local_70->m_outerIndex[lVar17];
        if (local_70->m_innerNonZeros == (Index *)0x0) {
          iVar23 = local_70->m_outerIndex[lVar17 + 1];
        }
        else {
          iVar23 = local_70->m_innerNonZeros[lVar17] + iVar14;
        }
        bVar8 = iVar23 <= iVar14;
        if (!bVar8 || (long)uVar15 < local_78) {
          lVar17 = (long)iVar14;
          local_4c = uVar16;
          do {
            uVar13 = uVar15 & 0xffffffff;
            if (!bVar8) {
              uVar13 = (ulong)(uint)pIVar4[lVar17];
            }
            iVar14 = (int)uVar13;
            if ((iVar14 < 0) || (*(long *)(othersize + 8) <= (long)iVar14)) goto LAB_0014cd05;
            iVar14 = *(int *)(*(long *)othersize + (long)iVar14 * 4);
            if ((long)iVar14 < (long)uVar15) {
              uVar10 = etree_find<int,Eigen::Matrix<int,_1,1,0,_1,1>>(iVar14,&local_60);
              if ((uint)local_48 <= uVar10) goto LAB_0014cd05;
              uVar2 = *(uint *)((long)local_38 + (long)(int)uVar10 * 4);
              if (uVar15 != uVar2) {
                if (((int)uVar2 < 0) || ((local_80->m_storage).m_rows <= (long)(int)uVar2))
                goto LAB_0014cd05;
                (local_80->m_storage).m_data[(int)uVar2] = uVar16;
                if (((int)local_4c < 0) ||
                   (local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows <= (int)local_4c)) goto LAB_0014cd05;
                local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[(int)local_4c] = uVar10;
                *(uint *)((long)local_38 + (long)(int)uVar10 * 4) = uVar16;
                local_4c = uVar10;
              }
            }
            bVar7 = (bool)(bVar7 | uVar15 == uVar13);
            bVar8 = (long)iVar23 <= lVar17 + 1;
            lVar17 = lVar17 + 1;
          } while (!(bool)(bVar8 & bVar7));
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != local_68);
    }
  }
  free(local_60.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_38);
  return 0;
}

Assistant:

int coletree(const MatrixType& mat, IndexVector& parent, IndexVector& firstRowElt, typename MatrixType::Index *perm=0)
{
  typedef typename MatrixType::Index Index;
  Index nc = mat.cols(); // Number of columns 
  Index m = mat.rows();
  Index diagSize = (std::min)(nc,m);
  IndexVector root(nc); // root of subtree of etree 
  root.setZero();
  IndexVector pp(nc); // disjoint sets 
  pp.setZero(); // Initialize disjoint sets 
  parent.resize(mat.cols());
  //Compute first nonzero column in each row 
  Index row,col; 
  firstRowElt.resize(m);
  firstRowElt.setConstant(nc);
  firstRowElt.segment(0, diagSize).setLinSpaced(diagSize, 0, diagSize-1);
  bool found_diag;
  for (col = 0; col < nc; col++)
  {
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it; ++it)
    { 
      row = it.row();
      firstRowElt(row) = (std::min)(firstRowElt(row), col);
    }
  }
  /* Compute etree by Liu's algorithm for symmetric matrices,
          except use (firstRowElt[r],c) in place of an edge (r,c) of A.
    Thus each row clique in A'*A is replaced by a star
    centered at its first vertex, which has the same fill. */
  Index rset, cset, rroot; 
  for (col = 0; col < nc; col++) 
  {
    found_diag = col>=m;
    pp(col) = col; 
    cset = col; 
    root(cset) = col; 
    parent(col) = nc; 
    /* The diagonal element is treated here even if it does not exist in the matrix
     * hence the loop is executed once more */ 
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it||!found_diag; ++it)
    { //  A sequence of interleaved find and union is performed 
      Index i = col;
      if(it) i = it.index();
      if (i == col) found_diag = true;
      
      row = firstRowElt(i);
      if (row >= col) continue; 
      rset = internal::etree_find(row, pp); // Find the name of the set containing row
      rroot = root(rset);
      if (rroot != col) 
      {
        parent(rroot) = col; 
        pp(cset) = rset; 
        cset = rset; 
        root(cset) = col; 
      }
    }
  }
  return 0;  
}